

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O0

S2RegionTermIndexer * __thiscall
S2RegionTermIndexer::GetTerm_abi_cxx11_
          (S2RegionTermIndexer *this,TermType term_type,S2CellId *id,string_view prefix)

{
  string_view pc;
  string_view pc_00;
  string *str;
  undefined4 in_register_00000034;
  Options *this_00;
  size_type in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [32];
  AlphaNum local_178;
  AlphaNum local_148;
  S2RegionTermIndexer *local_118;
  AlphaNum local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  AlphaNum local_a8;
  S2RegionTermIndexer *local_78;
  AlphaNum local_68;
  char *local_38;
  S2CellId *id_local;
  Options *pOStack_28;
  TermType term_type_local;
  S2RegionTermIndexer *this_local;
  string_view prefix_local;
  
  this_00 = (Options *)CONCAT44(in_register_00000034,term_type);
  local_118 = (S2RegionTermIndexer *)prefix.length_;
  local_38 = prefix.ptr_;
  id_local._4_4_ = (int)id;
  pOStack_28 = this_00;
  this_local = local_118;
  prefix_local.length_ = (size_type)this;
  if (id_local._4_4_ == 0) {
    pc_00.length_ = in_R9;
    pc_00.ptr_ = (char *)local_118;
    local_78 = local_118;
    absl::AlphaNum::AlphaNum(&local_68,pc_00);
    S2CellId::ToToken_abi_cxx11_((S2CellId *)local_c8);
    absl::AlphaNum::AlphaNum<std::allocator<char>>(&local_a8,local_c8);
    absl::StrCat_abi_cxx11_((absl *)this,&local_68,&local_a8);
    std::__cxx11::string::~string((string *)local_c8);
  }
  else {
    pc.length_ = in_R9;
    pc.ptr_ = (char *)local_118;
    absl::AlphaNum::AlphaNum(&local_108,pc);
    str = Options::marker_abi_cxx11_(this_00);
    absl::AlphaNum::AlphaNum<std::allocator<char>>(&local_148,str);
    S2CellId::ToToken_abi_cxx11_((S2CellId *)local_198);
    absl::AlphaNum::AlphaNum<std::allocator<char>>(&local_178,local_198);
    absl::StrCat_abi_cxx11_((absl *)this,&local_108,&local_148,&local_178);
    std::__cxx11::string::~string((string *)local_198);
  }
  return this;
}

Assistant:

string S2RegionTermIndexer::GetTerm(TermType term_type, const S2CellId& id,
                                    string_view prefix) const {
  // There are generally more ancestor terms than covering terms, so we add
  // the extra "marker" character to the covering terms to distinguish them.
  if (term_type == TermType::ANCESTOR) {
    return absl::StrCat(prefix, id.ToToken());
  } else {
    return absl::StrCat(prefix, options_.marker(), id.ToToken());
  }
}